

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

int cmcmd_cmake_ninja_dyndep(const_iterator argBeg,const_iterator argEnd)

{
  bool bVar1;
  cmFileSetVisibility cVar2;
  Value *pVVar3;
  Value *pVVar4;
  mapped_type *this;
  Value *pVVar5;
  uint uVar6;
  pointer __x;
  string *this_00;
  cmake *this_01;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view name;
  const_iterator cVar7;
  undefined1 local_bc0 [32];
  undefined1 local_ba0 [16];
  Value tdio;
  string dir_top_src;
  string dir_top_bld;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linked_target_dirs;
  string arg_tdi;
  string dir_cur_bld;
  string module_dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arg_ddis;
  string arg_lang;
  string arg_dd;
  string arg_modmapfmt;
  string dir_cur_src;
  SelfType local_9e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arg_full;
  CxxModuleExportInfo export_info;
  cmake cm;
  
  cmSystemTools::HandleResponseFile(&arg_full,argBeg,argEnd);
  arg_dd._M_dataplus._M_p = (pointer)&arg_dd.field_2;
  arg_dd._M_string_length = 0;
  arg_dd.field_2._M_local_buf[0] = '\0';
  arg_lang._M_dataplus._M_p = (pointer)&arg_lang.field_2;
  arg_lang._M_string_length = 0;
  arg_tdi._M_dataplus._M_p = (pointer)&arg_tdi.field_2;
  arg_tdi._M_string_length = 0;
  arg_lang.field_2._M_local_buf[0] = '\0';
  arg_tdi.field_2._M_local_buf[0] = '\0';
  arg_modmapfmt._M_dataplus._M_p = (pointer)&arg_modmapfmt.field_2;
  arg_modmapfmt._M_string_length = 0;
  arg_modmapfmt.field_2._M_local_buf[0] = '\0';
  arg_ddis.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  arg_ddis.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  arg_ddis.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (__x = arg_full.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      __x != arg_full.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
    str._M_str = (__x->_M_dataplus)._M_p;
    str._M_len = __x->_M_string_length;
    bVar1 = cmHasLiteralPrefix<7ul>(str,(char (*) [7])0x5877b3);
    if (bVar1) {
      std::__cxx11::string::substr((ulong)&cm,(ulong)__x);
      this_00 = &arg_tdi;
LAB_0021e807:
      std::__cxx11::string::operator=((string *)this_00,(string *)&cm);
      std::__cxx11::string::~string((string *)&cm);
    }
    else {
      str_00._M_str = (__x->_M_dataplus)._M_p;
      str_00._M_len = __x->_M_string_length;
      bVar1 = cmHasLiteralPrefix<8ul>(str_00,(char (*) [8])0x586751);
      if (bVar1) {
        std::__cxx11::string::substr((ulong)&cm,(ulong)__x);
        this_00 = &arg_lang;
        goto LAB_0021e807;
      }
      str_01._M_str = (__x->_M_dataplus)._M_p;
      str_01._M_len = __x->_M_string_length;
      bVar1 = cmHasLiteralPrefix<6ul>(str_01,(char (*) [6])0x586782);
      if (bVar1) {
        std::__cxx11::string::substr((ulong)&cm,(ulong)__x);
        this_00 = &arg_dd;
        goto LAB_0021e807;
      }
      str_02._M_str = (__x->_M_dataplus)._M_p;
      str_02._M_len = __x->_M_string_length;
      bVar1 = cmHasLiteralPrefix<13ul>(str_02,(char (*) [13])0x58778f);
      if (bVar1) {
        std::__cxx11::string::substr((ulong)&cm,(ulong)__x);
        this_00 = &arg_modmapfmt;
        goto LAB_0021e807;
      }
      str_03._M_str = (__x->_M_dataplus)._M_p;
      str_03._M_len = __x->_M_string_length;
      bVar1 = cmHasLiteralPrefix<3ul>(str_03,(char (*) [3])0x5bfa13);
      if (bVar1) {
LAB_0021f3e0:
        cm.Generators.
        super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_00000028;
        cm.Generators.
        super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_7cbaa7;
        export_info.ObjectToFileSet._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             (__x->_M_dataplus)._M_p;
        export_info.ObjectToFileSet._M_t._M_impl._0_8_ = __x->_M_string_length;
        cmStrCat<>(&dir_cur_bld,(cmAlphaNum *)&cm,(cmAlphaNum *)&export_info);
        cmSystemTools::Error(&dir_cur_bld);
        this_01 = (cmake *)&dir_cur_bld;
        goto LAB_0021eb1f;
      }
      str_04._M_str = (__x->_M_dataplus)._M_p;
      str_04._M_len = __x->_M_string_length;
      bVar1 = cmHasLiteralSuffix<5ul>(str_04,(char (*) [5])".ddi");
      if (!bVar1) goto LAB_0021f3e0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&arg_ddis,__x);
    }
  }
  if (arg_tdi._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cm,"-E cmake_ninja_dyndep requires value for --tdi=",
               (allocator<char> *)&export_info);
    cmSystemTools::Error((string *)&cm);
  }
  else if (arg_lang._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cm,"-E cmake_ninja_dyndep requires value for --lang=",
               (allocator<char> *)&export_info);
    cmSystemTools::Error((string *)&cm);
  }
  else {
    if (arg_dd._M_string_length != 0) {
      Json::Value::Value(&tdio,nullValue);
      std::ifstream::ifstream(&cm,arg_tdi._M_dataplus._M_p,_S_in|_S_bin);
      Json::Reader::Reader((Reader *)&export_info);
      bVar1 = Json::Reader::parse((Reader *)&export_info,(istream *)&cm,&tdio,false);
      if (bVar1) {
        Json::Reader::~Reader((Reader *)&export_info);
        std::ifstream::~ifstream(&cm);
        pVVar3 = Json::Value::operator[](&tdio,"dir-cur-bld");
        Json::Value::asString_abi_cxx11_(&dir_cur_bld,pVVar3);
        pVVar3 = Json::Value::operator[](&tdio,"dir-cur-src");
        Json::Value::asString_abi_cxx11_(&dir_cur_src,pVVar3);
        pVVar3 = Json::Value::operator[](&tdio,"dir-top-bld");
        Json::Value::asString_abi_cxx11_(&dir_top_bld,pVVar3);
        pVVar3 = Json::Value::operator[](&tdio,"dir-top-src");
        Json::Value::asString_abi_cxx11_(&dir_top_src,pVVar3);
        pVVar3 = Json::Value::operator[](&tdio,"module-dir");
        Json::Value::asString_abi_cxx11_(&module_dir,pVVar3);
        if (module_dir._M_string_length != 0) {
          str_05._M_str = module_dir._M_dataplus._M_p;
          str_05._M_len = module_dir._M_string_length;
          bVar1 = cmHasLiteralSuffix<2ul>(str_05,(char (*) [2])0x5d3892);
          if (!bVar1) {
            std::__cxx11::string::push_back((char)&module_dir);
          }
        }
        linked_target_dirs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        linked_target_dirs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        linked_target_dirs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pVVar3 = Json::Value::operator[](&tdio,"linked-target-dirs");
        bVar1 = Json::Value::isArray(pVVar3);
        if (bVar1) {
          cVar7 = Json::Value::begin(pVVar3);
          export_info.ObjectToFileSet._M_t._M_impl._0_8_ =
               cVar7.super_ValueIteratorBase.current_._M_node;
          export_info.ObjectToFileSet._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ =
               cVar7.super_ValueIteratorBase.isNull_;
          cVar7 = Json::Value::end(pVVar3);
          local_bc0._0_8_ = cVar7.super_ValueIteratorBase.current_._M_node;
          local_bc0[8] = cVar7.super_ValueIteratorBase.isNull_;
          while( true ) {
            bVar1 = Json::ValueIteratorBase::operator!=
                              ((ValueIteratorBase *)&export_info,(SelfType *)local_bc0);
            if (!bVar1) break;
            pVVar3 = Json::ValueIteratorBase::deref((ValueIteratorBase *)&export_info);
            Json::Value::asString_abi_cxx11_((String *)&cm,pVVar3);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &linked_target_dirs,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cm);
            std::__cxx11::string::~string((string *)&cm);
            Json::ValueIteratorBase::increment((ValueIteratorBase *)&export_info);
          }
        }
        export_info.ObjectToFileSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &export_info.ObjectToFileSet._M_t._M_impl.super__Rb_tree_header._M_header;
        export_info.ObjectToFileSet._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             export_info.ObjectToFileSet._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
             0xffffffff00000000;
        export_info.ObjectToFileSet._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        export_info.ObjectToFileSet._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        export_info.BmiInstallation.super__Optional_base<CxxModuleBmiInstall,_false,_false>.
        _M_payload.super__Optional_payload<CxxModuleBmiInstall,_true,_false,_false>.
        super__Optional_payload_base<CxxModuleBmiInstall>._M_engaged = false;
        export_info.Exports.super__Vector_base<CxxModuleExport,_std::allocator<CxxModuleExport>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        export_info.Exports.super__Vector_base<CxxModuleExport,_std::allocator<CxxModuleExport>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        export_info.Exports.super__Vector_base<CxxModuleExport,_std::allocator<CxxModuleExport>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        export_info.Config._M_dataplus._M_p = (pointer)&export_info.Config.field_2;
        export_info.Config._M_string_length = 0;
        export_info.Config.field_2._M_local_buf[0] = '\0';
        export_info.ObjectToFileSet._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             export_info.ObjectToFileSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        pVVar3 = Json::Value::operator[](&tdio,"config");
        Json::Value::asString_abi_cxx11_((String *)&cm,pVVar3);
        std::__cxx11::string::operator=((string *)&export_info.Config,(string *)&cm);
        std::__cxx11::string::~string((string *)&cm);
        if (export_info.Config._M_string_length == 0) {
          std::__cxx11::string::assign((char *)&export_info.Config);
        }
        pVVar3 = Json::Value::operator[](&tdio,"exports");
        bVar1 = Json::Value::isArray(pVVar3);
        if (bVar1) {
          cVar7 = Json::Value::begin(pVVar3);
          local_ba0._0_8_ = cVar7.super_ValueIteratorBase.current_._M_node;
          local_ba0[8] = cVar7.super_ValueIteratorBase.isNull_;
          cVar7 = Json::Value::end(pVVar3);
          local_9e8.current_ = cVar7.super_ValueIteratorBase.current_._M_node;
          local_9e8.isNull_ = cVar7.super_ValueIteratorBase.isNull_;
          while( true ) {
            bVar1 = Json::ValueIteratorBase::operator!=((ValueIteratorBase *)local_ba0,&local_9e8);
            if (!bVar1) break;
            pVVar3 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_ba0);
            cm.Generators.
            super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)&cm.Generators.
                           super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
            cm.Generators.
            super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            cm.Generators.
            super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
            cm.ExtraGenerators.
            super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)&cm.DiagLevels;
            cm.ExtraGenerators.
            super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            cm.DiagLevels._M_t._M_impl._0_1_ = 0;
            cm.DiagLevels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)&cm.DiagLevels._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
            cm.DiagLevels._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
            cm.DiagLevels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 (_Base_ptr)
                 ((ulong)cm.DiagLevels._M_t._M_impl.super__Rb_tree_header._M_header._M_right &
                 0xffffffffffffff00);
            cm.GeneratorInstance._M_dataplus._M_p = (pointer)&cm.GeneratorInstance.field_2;
            cm.GeneratorInstance._M_string_length = 0;
            cm.GeneratorInstance.field_2._M_allocated_capacity =
                 cm.GeneratorInstance.field_2._M_allocated_capacity & 0xffffffffffffff00;
            cm.GeneratorPlatform._M_dataplus._M_p = (pointer)&cm.GeneratorPlatform.field_2;
            cm.GeneratorPlatform._M_string_length = 0;
            cm.GeneratorPlatform.field_2._M_allocated_capacity =
                 cm.GeneratorPlatform.field_2._M_allocated_capacity & 0xffffffffffffff00;
            pVVar4 = Json::Value::operator[](pVVar3,"install");
            cm.GeneratorToolset._M_dataplus._M_p._0_1_ = Json::Value::asBool(pVVar4);
            pVVar4 = Json::Value::operator[](pVVar3,"export-name");
            Json::Value::asString_abi_cxx11_((String *)local_bc0,pVVar4);
            std::__cxx11::string::operator=((string *)&cm,(string *)local_bc0);
            std::__cxx11::string::~string((string *)local_bc0);
            pVVar4 = Json::Value::operator[](pVVar3,"destination");
            Json::Value::asString_abi_cxx11_((String *)local_bc0,pVVar4);
            std::__cxx11::string::operator=
                      ((string *)
                       &cm.ExtraGenerators.
                        super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish,(string *)local_bc0);
            std::__cxx11::string::~string((string *)local_bc0);
            pVVar4 = Json::Value::operator[](pVVar3,"export-prefix");
            Json::Value::asString_abi_cxx11_((String *)local_bc0,pVVar4);
            std::__cxx11::string::operator=
                      ((string *)
                       &cm.DiagLevels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                       (string *)local_bc0);
            std::__cxx11::string::~string((string *)local_bc0);
            pVVar4 = Json::Value::operator[](pVVar3,"cxx-module-info-dir");
            Json::Value::asString_abi_cxx11_((String *)local_bc0,pVVar4);
            std::__cxx11::string::operator=((string *)&cm.GeneratorInstance,(string *)local_bc0);
            std::__cxx11::string::~string((string *)local_bc0);
            pVVar3 = Json::Value::operator[](pVVar3,"namespace");
            Json::Value::asString_abi_cxx11_((String *)local_bc0,pVVar3);
            std::__cxx11::string::operator=((string *)&cm.GeneratorPlatform,(string *)local_bc0);
            std::__cxx11::string::~string((string *)local_bc0);
            std::vector<CxxModuleExport,_std::allocator<CxxModuleExport>_>::push_back
                      (&export_info.Exports,(value_type *)&cm);
            CxxModuleExport::~CxxModuleExport((CxxModuleExport *)&cm);
            Json::ValueIteratorBase::increment((ValueIteratorBase *)local_ba0);
          }
        }
        pVVar3 = Json::Value::operator[](&tdio,"bmi-installation");
        bVar1 = Json::Value::isObject(pVVar3);
        if (bVar1) {
          cm.Generators.
          super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)&cm.Generators.
                         super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          cm.Generators.
          super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          cm.Generators.
          super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          cm.ExtraGenerators.
          super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)&cm.DiagLevels;
          cm.ExtraGenerators.
          super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          cm.DiagLevels._M_t._M_impl._0_1_ = 0;
          cm.DiagLevels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)&cm.DiagLevels._M_t._M_impl.super__Rb_tree_header._M_node_count;
          cm.DiagLevels._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
          cm.DiagLevels._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ = 0;
          cm.GeneratorInstance._M_string_length = (long)&cm.GeneratorInstance.field_2 + 8;
          cm.GeneratorInstance.field_2._M_allocated_capacity = 0;
          cm.GeneratorInstance.field_2._M_local_buf[8] = '\0';
          cm.GeneratorPlatform._M_string_length = (long)&cm.GeneratorPlatform.field_2 + 8;
          cm.GeneratorPlatform.field_2._M_allocated_capacity = 0;
          cm.GeneratorPlatform.field_2._M_local_buf[8] = '\0';
          pVVar4 = Json::Value::operator[](pVVar3,"component");
          Json::Value::asString_abi_cxx11_((String *)local_bc0,pVVar4);
          std::__cxx11::string::operator=((string *)&cm,(string *)local_bc0);
          std::__cxx11::string::~string((string *)local_bc0);
          pVVar4 = Json::Value::operator[](pVVar3,"destination");
          Json::Value::asString_abi_cxx11_((String *)local_bc0,pVVar4);
          std::__cxx11::string::operator=
                    ((string *)
                     &cm.ExtraGenerators.
                      super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish,(string *)local_bc0);
          std::__cxx11::string::~string((string *)local_bc0);
          pVVar4 = Json::Value::operator[](pVVar3,"exclude-from-all");
          bVar1 = Json::Value::asBool(pVVar4);
          cm.DiagLevels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)
               CONCAT71(cm.DiagLevels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._1_7_,
                        bVar1);
          pVVar4 = Json::Value::operator[](pVVar3,"optional");
          bVar1 = Json::Value::asBool(pVVar4);
          cm.DiagLevels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_2_ =
               CONCAT11(bVar1,cm.DiagLevels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent.
                              _0_1_);
          pVVar4 = Json::Value::operator[](pVVar3,"permissions");
          Json::Value::asString_abi_cxx11_((String *)local_bc0,pVVar4);
          std::__cxx11::string::operator=
                    ((string *)&cm.DiagLevels._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                     (string *)local_bc0);
          std::__cxx11::string::~string((string *)local_bc0);
          pVVar4 = Json::Value::operator[](pVVar3,"message-level");
          Json::Value::asString_abi_cxx11_((String *)local_bc0,pVVar4);
          std::__cxx11::string::operator=
                    ((string *)&cm.GeneratorInstance._M_string_length,(string *)local_bc0);
          std::__cxx11::string::~string((string *)local_bc0);
          pVVar3 = Json::Value::operator[](pVVar3,"script-location");
          Json::Value::asString_abi_cxx11_((String *)local_bc0,pVVar3);
          std::__cxx11::string::operator=
                    ((string *)&cm.GeneratorPlatform._M_string_length,(string *)local_bc0);
          std::__cxx11::string::~string((string *)local_bc0);
          std::optional<CxxModuleBmiInstall>::operator=
                    (&export_info.BmiInstallation,(CxxModuleBmiInstall *)&cm);
          CxxModuleBmiInstall::~CxxModuleBmiInstall((CxxModuleBmiInstall *)&cm);
        }
        pVVar3 = Json::Value::operator[](&tdio,"cxx-modules");
        bVar1 = Json::Value::isObject(pVVar3);
        if (bVar1) {
          cVar7 = Json::Value::begin(pVVar3);
          local_ba0._0_8_ = cVar7.super_ValueIteratorBase.current_._M_node;
          local_ba0[8] = cVar7.super_ValueIteratorBase.isNull_;
          while( true ) {
            cVar7 = Json::Value::end(pVVar3);
            cm.Generators.
            super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)cVar7.super_ValueIteratorBase.current_._M_node;
            cm.Generators.
            super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 (pointer)CONCAT71(cm.Generators.
                                   super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                   cVar7.super_ValueIteratorBase.isNull_);
            bVar1 = Json::ValueIteratorBase::operator!=
                              ((ValueIteratorBase *)local_ba0,(SelfType *)&cm);
            if (!bVar1) break;
            Json::ValueIteratorBase::key((Value *)&cm,(ValueIteratorBase *)local_ba0);
            Json::Value::asString_abi_cxx11_((String *)local_bc0,(Value *)&cm);
            this = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>_>_>
                   ::operator[](&export_info.ObjectToFileSet,(String *)local_bc0);
            std::__cxx11::string::~string((string *)local_bc0);
            Json::Value::~Value((Value *)&cm);
            pVVar4 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_ba0);
            pVVar5 = Json::Value::operator[](pVVar4,"name");
            Json::Value::asString_abi_cxx11_((String *)&cm,pVVar5);
            std::__cxx11::string::operator=((string *)this,(string *)&cm);
            std::__cxx11::string::~string((string *)&cm);
            pVVar5 = Json::Value::operator[](pVVar4,"relative-directory");
            Json::Value::asString_abi_cxx11_((String *)&cm,pVVar5);
            std::__cxx11::string::operator=((string *)&this->RelativeDirectory,(string *)&cm);
            std::__cxx11::string::~string((string *)&cm);
            pVVar5 = Json::Value::operator[](pVVar4,"source");
            Json::Value::asString_abi_cxx11_((String *)&cm,pVVar5);
            std::__cxx11::string::operator=((string *)&this->SourcePath,(string *)&cm);
            std::__cxx11::string::~string((string *)&cm);
            pVVar5 = Json::Value::operator[](pVVar4,"type");
            Json::Value::asString_abi_cxx11_((String *)&cm,pVVar5);
            std::__cxx11::string::operator=((string *)&this->Type,(string *)&cm);
            std::__cxx11::string::~string((string *)&cm);
            pVVar5 = Json::Value::operator[](pVVar4,"visibility");
            Json::Value::asString_abi_cxx11_((String *)&cm,pVVar5);
            name._M_str = (char *)cm.Generators.
                                  super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
            name._M_len = (size_t)cm.Generators.
                                  super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish;
            cVar2 = cmFileSetVisibilityFromName(name,(cmMakefile *)0x0);
            this->Visibility = cVar2;
            std::__cxx11::string::~string((string *)&cm);
            pVVar4 = Json::Value::operator[](pVVar4,"destination");
            bVar1 = Json::Value::isString(pVVar4);
            if (bVar1) {
              Json::Value::asString_abi_cxx11_((String *)&cm,pVVar4);
              std::optional<std::__cxx11::string>::operator=
                        ((optional<std::__cxx11::string> *)&this->Destination,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cm);
              std::__cxx11::string::~string((string *)&cm);
            }
            Json::ValueIteratorBase::increment((ValueIteratorBase *)local_ba0);
          }
        }
        cmake::cmake(&cm,RoleInternal,Unknown,Normal);
        cmake::SetHomeDirectory(&cm,&dir_top_src);
        cmake::SetHomeOutputDirectory(&cm,&dir_top_bld);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_bc0,"Ninja",(allocator<char> *)&local_9e8);
        cmake::CreateGlobalGenerator((cmake *)local_ba0,(string *)&cm,SUB81(local_bc0,0));
        std::__cxx11::string::~string((string *)local_bc0);
        if ((cmGlobalNinjaGenerator *)local_ba0._0_8_ == (cmGlobalNinjaGenerator *)0x0) {
          bVar1 = true;
        }
        else {
          bVar1 = cmGlobalNinjaGenerator::WriteDyndepFile
                            ((cmGlobalNinjaGenerator *)local_ba0._0_8_,&dir_top_src,&dir_top_bld,
                             &dir_cur_src,&dir_cur_bld,&arg_dd,&arg_ddis,&module_dir,
                             &linked_target_dirs,&arg_lang,&arg_modmapfmt,&export_info);
          bVar1 = !bVar1;
          if ((cmGlobalNinjaGenerator *)local_ba0._0_8_ != (cmGlobalNinjaGenerator *)0x0) {
            (**(code **)(*(long *)local_ba0._0_8_ + 8))();
          }
        }
        uVar6 = (uint)bVar1;
        cmake::~cmake(&cm);
        cmGlobalNinjaGenerator::CxxModuleExportInfo::~CxxModuleExportInfo(&export_info);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&linked_target_dirs);
        std::__cxx11::string::~string((string *)&module_dir);
        std::__cxx11::string::~string((string *)&dir_top_src);
        std::__cxx11::string::~string((string *)&dir_top_bld);
        std::__cxx11::string::~string((string *)&dir_cur_src);
        std::__cxx11::string::~string((string *)&dir_cur_bld);
      }
      else {
        dir_cur_bld._M_dataplus._M_p = (pointer)0x26;
        dir_cur_bld._M_string_length = (size_type)anon_var_dwarf_7cb76d;
        dir_cur_src._M_dataplus._M_p = (pointer)arg_tdi._M_string_length;
        dir_cur_src._M_string_length = (size_type)arg_tdi._M_dataplus._M_p;
        Json::Reader::getFormattedErrorMessages_abi_cxx11_(&dir_top_src,(Reader *)&export_info);
        cmStrCat<std::__cxx11::string>
                  (&dir_top_bld,(cmAlphaNum *)&dir_cur_bld,(cmAlphaNum *)&dir_cur_src,&dir_top_src);
        cmSystemTools::Error(&dir_top_bld);
        std::__cxx11::string::~string((string *)&dir_top_bld);
        std::__cxx11::string::~string((string *)&dir_top_src);
        Json::Reader::~Reader((Reader *)&export_info);
        std::ifstream::~ifstream(&cm);
        uVar6 = 1;
      }
      Json::Value::~Value(&tdio);
      goto LAB_0021f4ab;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cm,"-E cmake_ninja_dyndep requires value for --dd=",
               (allocator<char> *)&export_info);
    cmSystemTools::Error((string *)&cm);
  }
  this_01 = &cm;
LAB_0021eb1f:
  std::__cxx11::string::~string((string *)this_01);
  uVar6 = 1;
LAB_0021f4ab:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&arg_ddis);
  std::__cxx11::string::~string((string *)&arg_modmapfmt);
  std::__cxx11::string::~string((string *)&arg_tdi);
  std::__cxx11::string::~string((string *)&arg_lang);
  std::__cxx11::string::~string((string *)&arg_dd);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&arg_full);
  return uVar6;
}

Assistant:

int cmcmd_cmake_ninja_dyndep(std::vector<std::string>::const_iterator argBeg,
                             std::vector<std::string>::const_iterator argEnd)
{
  std::vector<std::string> arg_full =
    cmSystemTools::HandleResponseFile(argBeg, argEnd);

  std::string arg_dd;
  std::string arg_lang;
  std::string arg_tdi;
  std::string arg_modmapfmt;
  std::vector<std::string> arg_ddis;
  for (std::string const& arg : arg_full) {
    if (cmHasLiteralPrefix(arg, "--tdi=")) {
      arg_tdi = arg.substr(6);
    } else if (cmHasLiteralPrefix(arg, "--lang=")) {
      arg_lang = arg.substr(7);
    } else if (cmHasLiteralPrefix(arg, "--dd=")) {
      arg_dd = arg.substr(5);
    } else if (cmHasLiteralPrefix(arg, "--modmapfmt=")) {
      arg_modmapfmt = arg.substr(12);
    } else if (!cmHasLiteralPrefix(arg, "--") &&
               cmHasLiteralSuffix(arg, ".ddi")) {
      arg_ddis.push_back(arg);
    } else {
      cmSystemTools::Error(
        cmStrCat("-E cmake_ninja_dyndep unknown argument: ", arg));
      return 1;
    }
  }
  if (arg_tdi.empty()) {
    cmSystemTools::Error("-E cmake_ninja_dyndep requires value for --tdi=");
    return 1;
  }
  if (arg_lang.empty()) {
    cmSystemTools::Error("-E cmake_ninja_dyndep requires value for --lang=");
    return 1;
  }
  if (arg_dd.empty()) {
    cmSystemTools::Error("-E cmake_ninja_dyndep requires value for --dd=");
    return 1;
  }

  Json::Value tdio;
  Json::Value const& tdi = tdio;
  {
    cmsys::ifstream tdif(arg_tdi.c_str(), std::ios::in | std::ios::binary);
    Json::Reader reader;
    if (!reader.parse(tdif, tdio, false)) {
      cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to parse ",
                                    arg_tdi,
                                    reader.getFormattedErrorMessages()));
      return 1;
    }
  }

  std::string const dir_cur_bld = tdi["dir-cur-bld"].asString();
  std::string const dir_cur_src = tdi["dir-cur-src"].asString();
  std::string const dir_top_bld = tdi["dir-top-bld"].asString();
  std::string const dir_top_src = tdi["dir-top-src"].asString();
  std::string module_dir = tdi["module-dir"].asString();
  if (!module_dir.empty() && !cmHasLiteralSuffix(module_dir, "/")) {
    module_dir += '/';
  }
  std::vector<std::string> linked_target_dirs;
  Json::Value const& tdi_linked_target_dirs = tdi["linked-target-dirs"];
  if (tdi_linked_target_dirs.isArray()) {
    for (auto const& tdi_linked_target_dir : tdi_linked_target_dirs) {
      linked_target_dirs.push_back(tdi_linked_target_dir.asString());
    }
  }

  cmGlobalNinjaGenerator::CxxModuleExportInfo export_info;
  export_info.Config = tdi["config"].asString();
  if (export_info.Config.empty()) {
    export_info.Config = "noconfig";
  }
  Json::Value const& tdi_exports = tdi["exports"];
  if (tdi_exports.isArray()) {
    for (auto const& tdi_export : tdi_exports) {
      CxxModuleExport exp;
      exp.Install = tdi_export["install"].asBool();
      exp.Name = tdi_export["export-name"].asString();
      exp.Destination = tdi_export["destination"].asString();
      exp.Prefix = tdi_export["export-prefix"].asString();
      exp.CxxModuleInfoDir = tdi_export["cxx-module-info-dir"].asString();
      exp.Namespace = tdi_export["namespace"].asString();

      export_info.Exports.push_back(exp);
    }
  }
  auto const& bmi_installation = tdi["bmi-installation"];
  if (bmi_installation.isObject()) {
    CxxModuleBmiInstall bmi_install;

    bmi_install.Component = bmi_installation["component"].asString();
    bmi_install.Destination = bmi_installation["destination"].asString();
    bmi_install.ExcludeFromAll = bmi_installation["exclude-from-all"].asBool();
    bmi_install.Optional = bmi_installation["optional"].asBool();
    bmi_install.Permissions = bmi_installation["permissions"].asString();
    bmi_install.MessageLevel = bmi_installation["message-level"].asString();
    bmi_install.ScriptLocation =
      bmi_installation["script-location"].asString();

    export_info.BmiInstallation = bmi_install;
  }
  Json::Value const& tdi_cxx_modules = tdi["cxx-modules"];
  if (tdi_cxx_modules.isObject()) {
    for (auto i = tdi_cxx_modules.begin(); i != tdi_cxx_modules.end(); ++i) {
      CxxModuleFileSet& fsi = export_info.ObjectToFileSet[i.key().asString()];
      auto const& tdi_cxx_module_info = *i;
      fsi.Name = tdi_cxx_module_info["name"].asString();
      fsi.RelativeDirectory =
        tdi_cxx_module_info["relative-directory"].asString();
      fsi.SourcePath = tdi_cxx_module_info["source"].asString();
      fsi.Type = tdi_cxx_module_info["type"].asString();
      fsi.Visibility = cmFileSetVisibilityFromName(
        tdi_cxx_module_info["visibility"].asString(), nullptr);
      auto const& tdi_fs_dest = tdi_cxx_module_info["destination"];
      if (tdi_fs_dest.isString()) {
        fsi.Destination = tdi_fs_dest.asString();
      }
    }
  }

  cmake cm(cmake::RoleInternal, cmState::Unknown);
  cm.SetHomeDirectory(dir_top_src);
  cm.SetHomeOutputDirectory(dir_top_bld);
  auto ggd = cm.CreateGlobalGenerator("Ninja");
  if (!ggd ||
      !cm::static_reference_cast<cmGlobalNinjaGenerator>(ggd).WriteDyndepFile(
        dir_top_src, dir_top_bld, dir_cur_src, dir_cur_bld, arg_dd, arg_ddis,
        module_dir, linked_target_dirs, arg_lang, arg_modmapfmt,
        export_info)) {
    return 1;
  }
  return 0;
}